

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatOperand
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Operand_ *op)

{
  Error EVar1;
  Error EVar2;
  ulong uVar3;
  uint32_t uVar4;
  char *str;
  uint uVar5;
  uint32_t uVar6;
  ulong i;
  bool bVar7;
  
  uVar5 = (op->field_0)._any.signature;
  switch(uVar5 & 7) {
  case 1:
    EVar1 = X86Logging::formatRegister
                      (sb,logOptions,emitter,0x1418a0,uVar5 >> 3 & 0x1f,(op->field_0)._any.id);
    return EVar1;
  case 2:
    break;
  case 3:
    uVar3 = *(ulong *)((long)&op->field_0 + 8);
    if (uVar3 < 10 || (logOptions & 4) == 0) {
      uVar4 = 10;
      uVar6 = 0x80000000;
    }
    else {
      uVar4 = 0x10;
      uVar6 = 0;
    }
    EVar1 = StringBuilder::_opNumber(sb,1,uVar3,uVar4,0,uVar6);
    return EVar1;
  case 4:
    EVar1 = formatLabel(sb,logOptions,emitter,(op->field_0)._any.id);
    return EVar1;
  default:
    EVar1 = StringBuilder::_opString(sb,1,"<None>",0xffffffffffffffff);
    return EVar1;
  }
  uVar5 = uVar5 >> 0x18;
  switch(uVar5) {
  case 1:
    str = "byte ";
    break;
  case 2:
    str = "word ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_001246c5_caseD_3:
    str = "";
    break;
  case 4:
    str = "dword ";
    break;
  case 6:
    str = "fword ";
    break;
  case 8:
    str = "qword ";
    break;
  case 10:
    str = "tword ";
    break;
  case 0x10:
    str = "oword ";
    break;
  default:
    if (uVar5 == 0x20) {
      str = "yword ";
    }
    else {
      if (uVar5 != 0x40) goto switchD_001246c5_caseD_3;
      str = "zword ";
    }
  }
  EVar1 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
  if (EVar1 != 0) {
    return EVar1;
  }
  uVar5 = (op->field_0)._any.signature >> 0x12 & 7;
  uVar4 = uVar5 - 1;
  if (uVar4 < 6) {
    uVar4 = 0x141a90;
    EVar1 = StringBuilder::appendFormat(sb,"%s:",(ulong)uVar5 * 4 + 0x141b70);
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  uVar6 = 1;
  EVar1 = StringBuilder::_opChar(sb,1,'[');
  if (EVar1 != 0) {
    return EVar1;
  }
  if ((undefined1  [16])((undefined1  [16])op->field_0 & (undefined1  [16])0x2000) !=
      (undefined1  [16])0x0) {
    uVar6 = 1;
    uVar4 = 0xffffffff;
    EVar1 = StringBuilder::_opString(sb,1,"abs ",0xffffffffffffffff);
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  uVar5 = (op->field_0)._any.signature;
  if ((uVar5 & 0xf8) != 0) {
    uVar4 = uVar5 & 0xf8;
    if (uVar4 == 8) {
      uVar4 = (op->field_0)._any.reserved12_4;
      EVar1 = formatLabel(sb,logOptions,emitter,uVar4);
    }
    else {
      if ((uVar5 >> 0xe & 1) != 0) {
        uVar6 = 1;
        uVar4 = 0xffffffff;
        EVar1 = StringBuilder::_opString(sb,1,"$",0xffffffffffffffff);
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      if ((undefined1  [16])((undefined1  [16])op->field_0 & (undefined1  [16])0x8000) !=
          (undefined1  [16])0x0) {
        uVar6 = 1;
        uVar4 = 0xffffffff;
        EVar1 = StringBuilder::_opString(sb,1,"&",0xffffffffffffffff);
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      EVar1 = X86Logging::formatRegister
                        (sb,uVar6,emitter,uVar4,(op->field_0)._any.signature >> 3 & 0x1f,
                         (op->field_0)._any.reserved12_4);
    }
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  if ((undefined1  [16])((undefined1  [16])op->field_0 & (undefined1  [16])0x1f00) !=
      (undefined1  [16])0x0) {
    uVar6 = 1;
    EVar1 = StringBuilder::_opChar(sb,1,'+');
    if (EVar1 != 0) {
      return EVar1;
    }
    EVar1 = X86Logging::formatRegister
                      (sb,uVar6,emitter,uVar4,(op->field_0)._any.signature >> 8 & 0x1f,
                       (op->field_0)._any.id);
    if (EVar1 != 0) {
      return EVar1;
    }
    uVar5 = (op->field_0)._any.signature;
    if (((uVar5 & 0x30000) != 0) &&
       (EVar1 = StringBuilder::appendFormat
                          (sb,"*%u",(ulong)(uint)(1 << ((byte)(uVar5 >> 0x10) & 3))), EVar1 != 0)) {
      return EVar1;
    }
  }
  if ((undefined1  [16])((undefined1  [16])op->field_0 & (undefined1  [16])0xf8) ==
      (undefined1  [16])0x0) {
    uVar3 = *(ulong *)((long)&op->field_0 + 8);
  }
  else {
    uVar3 = (ulong)(int)(op->field_0)._any.reserved8_4;
  }
  if (uVar3 == 0) goto LAB_001249e4;
  i = -uVar3;
  if (0 < (long)uVar3) {
    i = uVar3;
  }
  EVar1 = StringBuilder::_opChar(sb,1,(char)((long)uVar3 >> 0x3f) * -2 + '+');
  if (EVar1 == 0) {
    uVar4 = 10;
    if (((logOptions & 8) != 0) && (9 < i)) {
      EVar1 = StringBuilder::_opString(sb,1,"0x",2);
      if (EVar1 != 0) goto LAB_00124982;
      uVar4 = 0x10;
    }
    EVar2 = StringBuilder::_opNumber(sb,1,i,uVar4,0,0);
    bVar7 = EVar2 == 0;
    EVar1 = 0;
    if (!bVar7) {
      EVar1 = EVar2;
    }
  }
  else {
LAB_00124982:
    bVar7 = false;
  }
  if (!bVar7) {
    return EVar1;
  }
LAB_001249e4:
  EVar1 = StringBuilder::_opChar(sb,1,']');
  return EVar1;
}

Assistant:

Error Logging::formatOperand(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Operand_& op) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}